

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-atom.c
# Opt level: O3

int fy_atom_format_text_length(fy_atom *atom)

{
  fy_iter_chunk *curr;
  int iVar1;
  size_t sVar2;
  int ret;
  int local_214;
  fy_atom_iter local_210;
  
  iVar1 = -1;
  if (atom != (fy_atom *)0x0) {
    if ((atom->field_0x35 & 8) == 0) {
      fy_atom_iter_start(atom,&local_210);
      sVar2 = 0;
      curr = fy_atom_iter_chunk_next(&local_210,(fy_iter_chunk *)0x0,&local_214);
      if (curr != (fy_iter_chunk *)0x0) {
        sVar2 = 0;
        do {
          sVar2 = sVar2 + curr->len;
          curr = fy_atom_iter_chunk_next(&local_210,curr,&local_214);
        } while (curr != (fy_iter_chunk *)0x0);
      }
      if (local_210.chunks != local_210.startup_chunks &&
          local_210.chunks != (fy_atom_iter_chunk *)0x0) {
        free(local_210.chunks);
      }
      if ((-1 < (int)sVar2) && (iVar1 = local_214, local_214 == 0)) {
        atom->storage_hint = sVar2;
        atom->field_0x35 = atom->field_0x35 | 8;
        iVar1 = (int)sVar2;
      }
    }
    else {
      iVar1 = (int)atom->storage_hint;
    }
  }
  return iVar1;
}

Assistant:

int fy_atom_format_text_length(struct fy_atom *atom) {
    struct fy_atom_iter iter;
    const struct fy_iter_chunk *ic;
    size_t len;
    int ret;

    if (!atom)
        return -1;

    if (atom->storage_hint_valid)
        return atom->storage_hint;

    len = 0;
    fy_atom_iter_start(atom, &iter);
    ic = NULL;
    while ((ic = fy_atom_iter_chunk_next(&iter, ic, &ret)) != NULL)
        len += ic->len;
    fy_atom_iter_finish(&iter);

    /* something funky going on here */
    if ((int) len < 0)
        return -1;

    if (ret != 0)
        return ret;

    atom->storage_hint = (size_t) len;
    atom->storage_hint_valid = true;
    return (int) len;
}